

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyTLASState
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,TopLevelASType *TLAS,
          RESOURCE_STATE RequiredState,char *OperationName)

{
  undefined *puVar1;
  bool bVar2;
  RESOURCE_STATE RVar3;
  TopLevelASDesc *Args_1;
  undefined8 uVar4;
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  char (*in_stack_ffffffffffffff50) [132];
  String local_88;
  String local_68;
  undefined1 local_48 [8];
  string _msg;
  char *OperationName_local;
  RESOURCE_STATE RequiredState_local;
  TopLevelASType *TLAS_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  _msg.field_2._8_8_ = OperationName;
  bVar2 = TopLevelASBase<Diligent::EngineVkImplTraits>::IsInKnownState
                    (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
  if ((bVar2) &&
     (bVar2 = TopLevelASBase<Diligent::EngineVkImplTraits>::CheckState
                        (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,RequiredState),
     !bVar2)) {
    Args_1 = DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
             ::GetDesc((DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                        *)TLAS);
    GetResourceStateString_abi_cxx11_(&local_68,(Diligent *)(ulong)RequiredState,State);
    RVar3 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetState
                      (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
    GetResourceStateString_abi_cxx11_(&local_88,(Diligent *)(ulong)RVar3,State_00);
    FormatString<char_const*,char[17],char_const*,char[25],std::__cxx11::string,char[28],std::__cxx11::string,char[132]>
              ((string *)local_48,(Diligent *)(_msg.field_2._M_local_buf + 8),
               (char **)" requires TLAS \'",(char (*) [17])Args_1,
               (char **)"\' to be transitioned to ",(char (*) [25])&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " state. Actual TLAS state: ",(char (*) [28])&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ". Use appropriate state transition flags or explicitly transition the TLAS using IDeviceContext::TransitionResourceStates() method."
               ,in_stack_ffffffffffffff50);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar4,0);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifyTLASState(
    const TopLevelASType& TLAS,
    RESOURCE_STATE        RequiredState,
    const char*           OperationName) const
{
    if (TLAS.IsInKnownState() && !TLAS.CheckState(RequiredState))
    {
        LOG_ERROR_MESSAGE(OperationName, " requires TLAS '", TLAS.GetDesc().Name, "' to be transitioned to ", GetResourceStateString(RequiredState),
                          " state. Actual TLAS state: ", GetResourceStateString(TLAS.GetState()),
                          ". Use appropriate state transition flags or explicitly transition the TLAS using IDeviceContext::TransitionResourceStates() method.");
    }
}